

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q2.cpp
# Opt level: O0

BSTree<const_int_&,_int>
bstree_from_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
          (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *begin,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *end,
          int *default_value)

{
  anon_class_24_3_04ddf3ad local_68;
  undefined1 local_50 [8];
  Function inserter;
  BSTree<const_int_&,_int> bst;
  int *default_value_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *begin_local;
  
  BSTree<const_int_&,_int>::BSTree((BSTree<const_int_&,_int> *)&inserter._M_invoker);
  local_68.inserter = (Function *)local_50;
  local_68.bst = (BSTree<const_int_&,_int> *)&inserter._M_invoker;
  std::
  function<void(__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&)>
  ::
  function<bstree_from_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>(__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,int_const&)::_lambda(auto:1_const&,auto:2_const&)_1_,void>
            ((function<void(__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>const&)>
              *)local_68.inserter,&local_68);
  std::
  function<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&)>
  ::operator()((function<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&)>
                *)local_50,end,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               default_value);
  BSTree<const_int_&,_int>::BSTree
            ((BSTree<const_int_&,_int> *)begin,(BSTree<const_int_&,_int> *)&inserter._M_invoker);
  std::
  function<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&)>
  ::~function((function<void_(const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&,_const___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_&)>
               *)local_50);
  BSTree<const_int_&,_int>::~BSTree((BSTree<const_int_&,_int> *)&inserter._M_invoker);
  return (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>)
         (BSTreeWithNode<BSTree<const_int_&,_int>::BSTreeNode>)begin;
}

Assistant:

auto bstree_from_sorted(const Iterator& begin, const Iterator& end, const Val& default_value){
  // we are going to use Key as the type of elements within range
  // [begin, end)
  using Key      = decltype(*begin);
  // we are going to use a recursive function to perform the insertions
  using Function = std::function<void(const Iterator&, const Iterator&)>;

  // an empty BSTree
  BSTree<Key, Val> bst {};

  Function inserter {[&bst, &default_value, &inserter](const auto& begin, const auto& end) {
                       // if range is not empty
                       if (begin < end){
                         // we calculate half of the range length
                         auto length      {std::distance(begin, end)};
                         auto half_length {length / 2};

                         // we insert the middle element (odd length)
                         // or the first element of second half (even
                         // length)
                         bst.insert(*(begin + half_length), default_value);

                         // we recurse into each half, excluding the
                         // element that was just inserted
                         inserter(begin, begin + half_length);
                         inserter(begin + half_length + 1, end);
                       }
                     }};

  // we begin the insertion process to the whole range
  inserter(begin, end);

  // at the end, we return the BSTree
  return bst;
}